

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNChPt.h
# Opt level: O1

void __thiscall NaPNCheckPoint::~NaPNCheckPoint(NaPNCheckPoint *this)

{
  (this->super_NaPNFileOutput).super_NaPetriNode._vptr_NaPetriNode =
       (_func_int **)&PTR__NaPNCheckPoint_00175000;
  NaPetriCnOutput::~NaPetriCnOutput(&this->out);
  NaPNFileOutput::~NaPNFileOutput(&this->super_NaPNFileOutput);
  operator_delete(this,0x128);
  return;
}

Assistant:

class PNNA_API NaPNCheckPoint : public NaPNFileOutput
{
public:

    // Create node for Petri network
    NaPNCheckPoint (const char* szNodeName = "chkpnt");


    ////////////////
    // Connectors //
    ////////////////

    // Output (mainstream)
    NaPetriCnOutput     out;


    ///////////////////
    // Node specific //
    ///////////////////

    // Switch for information stand trace of values on the node
    virtual void        set_info_trace (bool flag);


    ///////////////////////
    // Phases of network //
    ///////////////////////

    // 2. Link connectors inside the node
    virtual void        relate_connectors ();

    // 4. Allocate resources for internal usage
    virtual void        allocate_resources ();

    // 5. Verification to be sure all is OK (true)
    virtual bool        verify ();

    // 8. True action of the node (if activate returned true)
    virtual void        action ();

protected:

    // Switcher for information stand tracing
    bool                bInfo;

    // Information stand trace id
    NaTraceId           idTrace;

}